

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O2

void __thiscall SharedDirectory::index_files(SharedDirectory *this)

{
  type_conflict1 tVar1;
  bool bVar2;
  reference pdVar3;
  uintmax_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  directory_iterator itr;
  directory_iterator end;
  uint64_t size;
  path file;
  directory_iterator local_90;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_88;
  SharedDirectory *local_80;
  uintmax_t local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  local_88.px = (dir_itr_imp *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *)this);
  local_80 = this;
  boost::filesystem::directory_iterator::directory_iterator(&local_90,&this->shared_dir,none);
  uVar6 = 0;
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&local_90,
                       (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&local_88);
    if (!tVar1) break;
    pdVar3 = boost::filesystem::directory_iterator::dereference(&local_90);
    std::__cxx11::string::string(local_50,(string *)pdVar3);
    pdVar3 = boost::filesystem::directory_iterator::dereference(&local_90);
    bVar2 = boost::filesystem::is_regular_file((path *)pdVar3);
    if (bVar2) {
      uVar4 = boost::filesystem::file_size((path *)local_50);
      local_78 = uVar4;
      boost::filesystem::path::filename();
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,unsigned_long&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)local_80,&local_70,&local_78);
      uVar6 = uVar6 + uVar4;
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string(local_50);
    boost::filesystem::directory_iterator::increment(&local_90);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_90.m_imp);
  uVar5 = 0;
  if (uVar6 <= local_80->total_space) {
    uVar5 = local_80->total_space - uVar6;
  }
  local_80->remaining_space = uVar5;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_88);
  return;
}

Assistant:

void SharedDirectory::index_files() {
  directory_iterator end;
  uint64_t actual_space = 0;
  indexed_files.clear();
  for (directory_iterator itr{shared_dir}; itr != end; ++itr) {
    auto file = itr->path();
    if (!is_regular_file(itr->path())) {
      continue;
    }
    uint64_t size = file_size(file);
    actual_space += size;
    indexed_files.emplace(file.filename().string(), size);
  }
  remaining_space = total_space < actual_space ? 0 : total_space - actual_space;
}